

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_func_sig_return_test.c
# Opt level: O1

void long_async_func(int report_val)

{
  uint __errnum;
  pid_t pVar1;
  __pid_t _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  
  _Var2 = fork();
  if (_Var2 != 0) {
    if (_Var2 != -1) {
      await_forks = await_forks + 1;
      return;
    }
    log_formatted("Cannot fork!");
LAB_00101319:
    exit(1);
  }
  close(0);
  close(1);
  iVar3 = sigprocmask(1,(sigset_t *)&block_mask,(sigset_t *)0x0);
  if (iVar3 == -1) {
    log_formatted("Failed to restore sig handlers!");
  }
  pVar1 = main_pid;
  if (report_val != 0) {
    iVar3 = __libc_current_sigrtmin();
    iVar3 = kill(pVar1,iVar3 + 1);
    pVar1 = main_pid;
    if (iVar3 == -1) {
      puVar4 = (uint *)__errno_location();
      __errnum = *puVar4;
      pcVar5 = strerror(__errnum);
      log_formatted("Cannot send signal to parent %d: %d, %s",(ulong)(uint)pVar1,(ulong)__errnum,
                    pcVar5);
      goto LAB_00101319;
    }
  }
  exit(0);
}

Assistant:

void long_async_func(int report_val) {
    int tmp_err = 0;

    switch (fork()) {
        case -1:
            log_formatted("Cannot fork!");
            exit(EXIT_FAILURE);
        case 0:
            close(0);
            close(1);
            tmp_err = sigprocmask(SIG_UNBLOCK, &block_mask, 0);
            if(tmp_err == -1) {
                log_formatted("Failed to restore sig handlers!");
            }
//            sleep(DELAY);

            // signal parent if necessary
            if(report_val) {
                tmp_err = kill(main_pid, NOTIFY_SIG);
                if(tmp_err == -1) {
                    log_formatted("Cannot send signal to parent %d: %d, %s", main_pid, errno, strerror(errno));
                    exit(EXIT_FAILURE);
                }
            }
            exit(EXIT_SUCCESS);
        default:
            await_forks++;
    }
}